

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_cursor.cpp
# Opt level: O0

int Am_Cursor_Data::remove(char *__filename)

{
  Am_Cursor_Data *local_20;
  Am_Cursor_Data *curr;
  Am_Cursor_Data *prev;
  Am_Cursor_Data *cursor_local;
  
  curr = (Am_Cursor_Data *)0x0;
  local_20 = list;
  while( true ) {
    if (local_20 == (Am_Cursor_Data *)0x0) {
      return (int)local_20;
    }
    if (local_20 == (Am_Cursor_Data *)__filename) break;
    curr = local_20;
    local_20 = local_20->next;
  }
  if (curr == (Am_Cursor_Data *)0x0) {
    list = local_20->next;
    curr = (Am_Cursor_Data *)&list;
  }
  else {
    curr->next = local_20->next;
  }
  return (int)curr;
}

Assistant:

void
Am_Cursor_Data::remove(Am_Cursor_Data *cursor)
{
  Am_Cursor_Data *prev = nullptr;
  Am_Cursor_Data *curr = list;
  while (curr) {
    if (curr == cursor) {
      if (prev)
        prev->next = curr->next;
      else
        list = curr->next;
      return;
    }
    prev = curr;
    curr = curr->next;
  }
}